

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImU32 IVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  int iVar6;
  
  IVar4 = ImHashStr("Docking",0,0);
  iVar6 = (ctx->SettingsHandlers).Size;
  iVar2 = (ctx->SettingsHandlers).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar6 * 0x48,GImAllocatorUserData);
      pIVar3 = (ctx->SettingsHandlers).Data;
      if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar3,(long)(ctx->SettingsHandlers).Size * 0x48);
        pIVar3 = (ctx->SettingsHandlers).Data;
        if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (ctx->SettingsHandlers).Data = __dest;
      (ctx->SettingsHandlers).Capacity = iVar6;
    }
  }
  pIVar3 = (ctx->SettingsHandlers).Data;
  iVar6 = (ctx->SettingsHandlers).Size;
  pIVar3[iVar6].TypeName = "Docking";
  pIVar3[iVar6].TypeHash = IVar4;
  *(undefined4 *)&pIVar3[iVar6].field_0xc = 0;
  pIVar3[iVar6].ClearAllFn = DockSettingsHandler_ClearAll;
  pIVar3[iVar6].ReadInitFn = DockSettingsHandler_ClearAll;
  pIVar3[iVar6].ReadOpenFn = DockSettingsHandler_ReadOpen;
  pIVar3[iVar6].ReadLineFn = DockSettingsHandler_ReadLine;
  pIVar3[iVar6].ApplyAllFn = DockSettingsHandler_ApplyAll;
  pIVar3[iVar6].WriteAllFn = DockSettingsHandler_WriteAll;
  pIVar3[iVar6].UserData = (void *)0x0;
  (ctx->SettingsHandlers).Size = (ctx->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ClearAllFn = DockSettingsHandler_ClearAll;
    ini_handler.ReadInitFn = DockSettingsHandler_ClearAll; // Also clear on read
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = DockSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}